

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_16(QPDF *pdf,char *arg2)

{
  undefined8 *puVar1;
  char cVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  unsigned_long i;
  QPDFObjectHandle QVar6;
  QPDFWriter w;
  QPDFObjectHandle page;
  QPDFObjectHandle pages;
  QPDFObjectHandle kids;
  QPDFObjectHandle root;
  QPDFObjectHandle contents;
  QPDFObjectHandle local_b0;
  long local_a0 [2];
  element_type local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  string local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  QPDFObjectHandle local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  QPDF local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  cVar2 = QPDF::everCalledGetAllPages();
  if (cVar2 != '\0') {
    __assert_fail("!pdf.everCalledGetAllPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2e9,"void test_16(QPDF &, const char *)");
  }
  plVar3 = (long *)QPDF::getAllPages();
  cVar2 = QPDF::everCalledGetAllPages();
  if (cVar2 == '\0') {
    __assert_fail("pdf.everCalledGetAllPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2eb,"void test_16(QPDF &, const char *)");
  }
  local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"New page 10","");
  createPageContents(local_30,(string *)pdf);
  if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_a0) {
    operator_delete(local_b0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_a0[0] + 1);
  }
  puVar1 = (undefined8 *)*plVar3;
  if ((undefined8 *)plVar3[1] == puVar1) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)*puVar1;
    local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
    if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_b0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_b0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    QPDFObjectHandle::shallowCopy();
    QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_90;
    QPDF::makeIndirectObject(QVar6);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/Contents","");
    QPDFObjectHandle::replaceKey((string *)local_90,&local_b0);
    if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_a0) {
      operator_delete(local_b0.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_a0[0] + 1);
    }
    QPDF::getRoot();
    local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/Pages","");
    QPDFObjectHandle::getKey(local_80);
    if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_a0) {
      operator_delete(local_b0.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_a0[0] + 1);
    }
    local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/Kids","");
    QPDFObjectHandle::getKey((string *)&local_60);
    if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_a0) {
      operator_delete(local_b0.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_a0[0] + 1);
    }
    local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/Parent","");
    QPDFObjectHandle::replaceKey((string *)local_90,&local_b0);
    if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_a0) {
      operator_delete(local_b0.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_a0[0] + 1);
    }
    local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/Count","");
    i = plVar3[1] - *plVar3 >> 4;
    if ((long)i < 0) {
      QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(i);
    }
    QPDFObjectHandle::newInteger((longlong)local_70);
    QPDFObjectHandle::replaceKey(local_80,&local_b0);
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_a0) {
      operator_delete(local_b0.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_a0[0] + 1);
    }
    QPDFObjectHandle::appendItem(&local_60);
    if (plVar3[1] - *plVar3 == 0xa0) {
      QPDF::updateAllPagesCache();
      cVar2 = QPDF::everCalledGetAllPages();
      if (cVar2 == '\0') {
        __assert_fail("pdf.everCalledGetAllPages()",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x2fb,"void test_16(QPDF &, const char *)");
      }
      if (plVar3[1] - *plVar3 == 0xb0) {
        lVar4 = QPDFObjectHandle::getObjGen();
        lVar5 = QPDFObjectHandle::getObjGen();
        if (lVar4 == lVar5) {
          QPDFWriter::QPDFWriter((QPDFWriter *)&local_b0,pdf,"a.pdf");
          QPDFWriter::setStaticID(SUB81(&local_b0,0));
          QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&local_b0);
          QPDFWriter::write();
          if (local_b0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b0.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (local_60.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
          }
          if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
          }
          if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
          }
          if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
          }
          return;
        }
        __assert_fail("all_pages.back().getObjGen() == page.getObjGen()",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x2fd,"void test_16(QPDF &, const char *)");
      }
      __assert_fail("all_pages.size() == 11",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x2fc,"void test_16(QPDF &, const char *)");
    }
  }
  __assert_fail("all_pages.size() == 10",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x2f9,"void test_16(QPDF &, const char *)");
}

Assistant:

static void
test_16(QPDF& pdf, char const* arg2)
{
    // Insert a page manually and then update the cache.
    assert(!pdf.everCalledGetAllPages());
    std::vector<QPDFObjectHandle> const& all_pages = pdf.getAllPages();
    assert(pdf.everCalledGetAllPages());

    QPDFObjectHandle contents = createPageContents(pdf, "New page 10");
    QPDFObjectHandle page = pdf.makeIndirectObject(QPDFObjectHandle(all_pages.at(0)).shallowCopy());
    page.replaceKey("/Contents", contents);

    // Insert the page manually.
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle pages = root.getKey("/Pages");
    QPDFObjectHandle kids = pages.getKey("/Kids");
    page.replaceKey("/Parent", pages);
    pages.replaceKey(
        "/Count", QPDFObjectHandle::newInteger(1 + QIntC::to_longlong(all_pages.size())));
    kids.appendItem(page);
    assert(all_pages.size() == 10);
    pdf.updateAllPagesCache();
    assert(pdf.everCalledGetAllPages());
    assert(all_pages.size() == 11);
    assert(all_pages.back().getObjGen() == page.getObjGen());

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}